

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

int vkt::tessellation::getClampedRoundedTessLevel(SpacingMode mode,float tessLevel)

{
  uint uVar1;
  float fVar2;
  
  if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
    fVar2 = 2.0;
    if (2.0 <= tessLevel) {
      fVar2 = tessLevel;
    }
    fVar2 = ceilf(fVar2);
    uVar1 = (int)fVar2 % 2 + (int)fVar2;
  }
  else if (mode == SPACINGMODE_FRACTIONAL_ODD) {
    fVar2 = 1.0;
    if (1.0 <= tessLevel) {
      fVar2 = tessLevel;
    }
    fVar2 = ceilf(fVar2);
    uVar1 = (int)fVar2 - ((int)fVar2 >> 0x1f) | 1;
  }
  else {
    uVar1 = 0;
    if (mode == SPACINGMODE_EQUAL) {
      fVar2 = 1.0;
      if (1.0 <= tessLevel) {
        fVar2 = tessLevel;
      }
      fVar2 = ceilf(fVar2);
      uVar1 = (uint)fVar2;
    }
  }
  return uVar1;
}

Assistant:

int getClampedRoundedTessLevel (const SpacingMode mode, const float tessLevel)
{
	return getRoundedTessLevel(mode, getClampedTessLevel(mode, tessLevel));
}